

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_functions.hpp
# Opt level: O1

int concatenate_results(void *arg,int ncols,char **vals,char **colnames)

{
  long lVar1;
  size_t sVar2;
  char *__s;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(long *)((long)arg + 8) == *arg) {
    Catch::clara::std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::resize((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)arg,(long)ncols);
  }
  if (0 < ncols) {
    lVar3 = 0;
    do {
      lVar1 = *arg;
      __s = *vals;
      if (__s == (char *)0x0) {
        __s = "NULL";
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar2 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (lVar1 + lVar3),&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      vals = vals + 1;
      lVar3 = lVar3 + 0x18;
    } while ((ulong)(uint)ncols * 0x18 != lVar3);
  }
  return 0;
}

Assistant:

static int concatenate_results(void *arg, int ncols, char **vals, char **colnames) {
	auto &results = *((std::vector<std::vector<std::string>> *)arg);
	if (results.size() == 0) {
		results.resize(ncols);
	}
	for (int i = 0; i < ncols; i++) {
		results[i].push_back(vals[i] ? vals[i] : "NULL");
	}
	return SQLITE_OK;
}